

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

void __thiscall InterpreterTest_SubF32_Test::TestBody(InterpreterTest_SubF32_Test *this)

{
  char *message;
  char *in_R9;
  initializer_list<wasm::Literal> __l;
  undefined1 local_578 [8];
  Module wasm;
  IRBuilder builder;
  anon_union_16_6_1532cd5a_for_Literal_0 local_d0;
  undefined8 local_c0;
  undefined1 local_b8 [8];
  Result<wasm::Expression_*> expr;
  __index_type local_98;
  AssertHelper local_90;
  undefined1 auStack_88 [8];
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> expected;
  __index_type local_68;
  undefined1 local_50 [8];
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> results;
  AssertionResult gtest_ar;
  AssertHelper local_20;
  
  ::wasm::Module::Module((Module *)local_578);
  builder.scopeStack.
  super__Vector_base<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)&builder.labelDepths._M_h._M_rehash_policy._M_next_resize;
  builder.wasm = (Module *)0x0;
  builder.debugLoc.
  super__Variant_base<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  .
  super__Move_assign_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  .
  super__Copy_assign_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  .
  super__Move_ctor_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  .
  super__Copy_ctor_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  .
  super__Variant_storage_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  ._M_u._12_1_ = 0;
  builder.debugLoc.
  super__Variant_base<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  .
  super__Move_assign_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  .
  super__Copy_assign_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  .
  super__Move_ctor_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  .
  super__Copy_ctor_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  .
  super__Variant_storage_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  ._16_8_ = 0;
  builder.scopeStack.
  super__Vector_base<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  builder.scopeStack.
  super__Vector_base<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  builder.builder.wasm = (Module *)0x0;
  builder.binaryPos = (size_t *)0x0;
  builder.lastBinaryPos = 0;
  builder.labelDepths._M_h._M_buckets = (__buckets_ptr)0x1;
  builder.labelDepths._M_h._M_bucket_count = 0;
  builder.labelDepths._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  builder.labelDepths._M_h._M_element_count._0_4_ = 0x3f800000;
  builder.labelDepths._M_h._M_single_bucket = (__node_base_ptr)0x0;
  builder.labelDepths._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  builder.labelDepths._M_h._M_rehash_policy._4_4_ = 0;
  builder.labelDepths._M_h._M_rehash_policy._M_next_resize = 0;
  builder.blockHint = 0x3f800000;
  wasm.tagsMap._M_h._M_single_bucket = (__node_base_ptr)local_578;
  builder.func = (Function *)local_578;
  ::wasm::IRBuilder::makeConst(_local_578);
  local_b8[0] = local_68 != '\x01';
  _expr = 0;
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)auStack_88);
  ::wasm::Literal::~Literal((Literal *)&builder.blockHint);
  if ((internal)local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)auStack_88,(internal *)local_b8,
               (AssertionResult *)"builder.makeConst(Literal(float(1.0))).getErr()","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/interpreter.cpp"
               ,0x25f,(char *)auStack_88);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(Message *)local_50);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&expr);
    local_d0.i32 = 0x40000000;
    local_c0 = 4;
    ::wasm::IRBuilder::makeConst(_local_578);
    local_b8[0] = local_68 != '\x01';
    _expr = 0;
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)auStack_88);
    ::wasm::Literal::~Literal((Literal *)&local_d0.func);
    if ((internal)local_b8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_50);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)auStack_88,(internal *)local_b8,
                 (AssertionResult *)"builder.makeConst(Literal(float(2.0))).getErr()","true","false"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 &results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/interpreter.cpp"
                 ,0x260,(char *)auStack_88);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)
                 &results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(Message *)local_50);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&expr);
      ::wasm::IRBuilder::makeBinary((BinaryOp)auStack_88);
      local_b8[0] = local_68 != '\x01';
      _expr = 0;
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)auStack_88);
      if ((internal)local_b8[0] != (internal)0x0) {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&expr);
        ::wasm::IRBuilder::build();
        results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_50[0] = (internal)(local_98 != '\x01');
        if (local_98 == '\x01') {
          testing::Message::Message
                    ((Message *)
                     &results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)auStack_88,(internal *)local_50,(AssertionResult *)"expr.getErr()",
                     "true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_20,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/interpreter.cpp"
                     ,0x264,(char *)auStack_88);
          testing::internal::AssertHelper::operator=
                    (&local_20,
                     (Message *)
                     &results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          testing::internal::AssertHelper::~AssertHelper(&local_20);
          std::__cxx11::string::~string((string *)auStack_88);
          if ((long *)CONCAT44(results.
                               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                               results.
                               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) !=
              (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(results.
                                           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                           results.
                                           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_)
                        + 8))();
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&results);
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&results);
          expected.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          expected.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          auStack_88 = (undefined1  [8])0x0;
          expected.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ::wasm::Interpreter::runTest((Expression *)local_50);
          ::wasm::interpreter::WasmStore::~WasmStore((WasmStore *)auStack_88);
          results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ = 0xbf800000;
          gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x4;
          __l._M_len = 1;
          __l._M_array = (iterator)
                         &results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage;
          std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::vector
                    ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)auStack_88,__l,
                     (allocator_type *)&local_20);
          ::wasm::Literal::~Literal
                    ((Literal *)
                     &results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          testing::internal::
          CmpHelperEQ<std::vector<wasm::Literal,std::allocator<wasm::Literal>>,std::vector<wasm::Literal,std::allocator<wasm::Literal>>>
                    ((internal *)
                     &results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,"results","expected",
                     (vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)local_50,
                     (vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)auStack_88);
          if ((char)results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage == '\0') {
            testing::Message::Message((Message *)&local_20);
            if (gtest_ar._0_8_ == 0) {
              message = "";
            }
            else {
              message = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_90,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/interpreter.cpp"
                       ,0x269,message);
            testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_20);
            testing::internal::AssertHelper::~AssertHelper(&local_90);
            if (local_20.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_20.data_ + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&gtest_ar);
          std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                    ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)auStack_88);
          std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                    ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)local_50);
        }
        std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)local_b8);
        goto LAB_001963fe;
      }
      testing::Message::Message((Message *)local_50);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)auStack_88,(internal *)local_b8,
                 (AssertionResult *)"builder.makeBinary(SubFloat32).getErr()","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 &results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/interpreter.cpp"
                 ,0x261,(char *)auStack_88);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)
                 &results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(Message *)local_50);
    }
  }
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)
             &results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)auStack_88);
  if ((long *)CONCAT71(local_50._1_7_,local_50[0]) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(local_50._1_7_,local_50[0]) + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&expr);
LAB_001963fe:
  ::wasm::IRBuilder::~IRBuilder((IRBuilder *)&wasm.tagsMap._M_h._M_single_bucket);
  ::wasm::Module::~Module((Module *)local_578);
  return;
}

Assistant:

TEST(InterpreterTest, SubF32) {
  Module wasm;
  IRBuilder builder(wasm);

  ASSERT_FALSE(builder.makeConst(Literal(float(1.0))).getErr());
  ASSERT_FALSE(builder.makeConst(Literal(float(2.0))).getErr());
  ASSERT_FALSE(builder.makeBinary(SubFloat32).getErr());

  auto expr = builder.build();
  ASSERT_FALSE(expr.getErr());

  auto results = Interpreter{}.runTest(*expr);
  std::vector<Literal> expected{Literal(float(-1.0))};

  EXPECT_EQ(results, expected);
}